

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O0

int mbedtls_rsa_rsassa_pkcs1_v15_sign
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig)

{
  int iVar1;
  void *__src;
  void *a;
  int in_ECX;
  uchar *in_RDX;
  mbedtls_rsa_context *in_RSI;
  uchar *in_RDI;
  int in_R8D;
  long in_R9;
  uchar *verif;
  uchar *sig_try;
  int ret;
  uchar *in_stack_00000068;
  uchar *in_stack_00000070;
  void *in_stack_00000078;
  _func_int_void_ptr_uchar_ptr_size_t *in_stack_00000080;
  mbedtls_rsa_context *in_stack_00000088;
  int local_34;
  uint in_stack_fffffffffffffffc;
  
  if (((in_ECX == 0) && (in_R8D == 0)) || (in_R9 != 0)) {
    if (*(int *)(in_RDI + 0xe0) == 0) {
      local_34 = rsa_rsassa_pkcs1_v15_encode
                           ((mbedtls_md_type_t)verif,in_stack_fffffffffffffffc,in_RDI,(size_t)in_RSI
                            ,in_RDX);
      if (local_34 == 0) {
        __src = calloc(1,*(size_t *)(in_RDI + 8));
        if (__src == (void *)0x0) {
          local_34 = -0x10;
        }
        else {
          a = calloc(1,*(size_t *)(in_RDI + 8));
          if (a == (void *)0x0) {
            free(__src);
            local_34 = -0x10;
          }
          else {
            local_34 = mbedtls_rsa_private(in_stack_00000088,in_stack_00000080,in_stack_00000078,
                                           in_stack_00000070,in_stack_00000068);
            if ((local_34 == 0) &&
               (local_34 = mbedtls_rsa_public(in_RSI,in_RDX,(uchar *)CONCAT44(in_ECX,in_R8D)),
               local_34 == 0)) {
              iVar1 = mbedtls_ct_memcmp(a,sig_try,*(size_t *)(in_RDI + 8));
              if (iVar1 == 0) {
                memcpy(sig_try,__src,*(size_t *)(in_RDI + 8));
              }
              else {
                local_34 = -0x4300;
              }
            }
            mbedtls_zeroize_and_free(__src,(size_t)a);
            mbedtls_zeroize_and_free(__src,(size_t)a);
            if (local_34 != 0) {
              memset(sig_try,0x21,*(size_t *)(in_RDI + 8));
            }
          }
        }
      }
    }
    else {
      local_34 = -0x4080;
    }
  }
  else {
    local_34 = -0x4080;
  }
  return local_34;
}

Assistant:

int mbedtls_rsa_rsassa_pkcs1_v15_sign(mbedtls_rsa_context *ctx,
                                      int (*f_rng)(void *, unsigned char *, size_t),
                                      void *p_rng,
                                      mbedtls_md_type_t md_alg,
                                      unsigned int hashlen,
                                      const unsigned char *hash,
                                      unsigned char *sig)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    unsigned char *sig_try = NULL, *verif = NULL;

    if ((md_alg != MBEDTLS_MD_NONE || hashlen != 0) && hash == NULL) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    if (ctx->padding != MBEDTLS_RSA_PKCS_V15) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    /*
     * Prepare PKCS1-v1.5 encoding (padding and hash identifier)
     */

    if ((ret = rsa_rsassa_pkcs1_v15_encode(md_alg, hashlen, hash,
                                           ctx->len, sig)) != 0) {
        return ret;
    }

    /* Private key operation
     *
     * In order to prevent Lenstra's attack, make the signature in a
     * temporary buffer and check it before returning it.
     */

    sig_try = (unsigned char*) mbedtls_calloc(1, ctx->len);
    if (sig_try == NULL) {
        return MBEDTLS_ERR_MPI_ALLOC_FAILED;
    }

    verif = (unsigned char*) mbedtls_calloc(1, ctx->len);
    if (verif == NULL) {
        mbedtls_free(sig_try);
        return MBEDTLS_ERR_MPI_ALLOC_FAILED;
    }

    MBEDTLS_MPI_CHK(mbedtls_rsa_private(ctx, f_rng, p_rng, sig, sig_try));
    MBEDTLS_MPI_CHK(mbedtls_rsa_public(ctx, sig_try, verif));

    if (mbedtls_ct_memcmp(verif, sig, ctx->len) != 0) {
        ret = MBEDTLS_ERR_RSA_PRIVATE_FAILED;
        goto cleanup;
    }

    memcpy(sig, sig_try, ctx->len);

cleanup:
    mbedtls_zeroize_and_free(sig_try, ctx->len);
    mbedtls_zeroize_and_free(verif, ctx->len);

    if (ret != 0) {
        memset(sig, '!', ctx->len);
    }
    return ret;
}